

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

void __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::FunctionScope::FunctionScope
          (FunctionScope *this,Function *function,Literals *arguments,ModuleRunner *parent)

{
  size_t *psVar1;
  pointer *ppNVar2;
  undefined8 *puVar3;
  iterator __position;
  pointer pLVar4;
  Type TVar5;
  pointer pLVar6;
  char cVar7;
  char *pcVar8;
  size_type __new_size;
  element_type *peVar9;
  Literal *pLVar10;
  uintptr_t *puVar11;
  ostream *poVar12;
  char *pcVar13;
  long lVar14;
  element_type *peVar15;
  long lVar16;
  initializer_list<wasm::Literal> init;
  Name name;
  Name name_00;
  Literal local_c8;
  undefined8 local_b0;
  Type params;
  anon_union_16_6_1532cd5a_for_Literal_0 local_a0;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_88;
  Literal *local_70;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_68;
  Function *local_48;
  FunctionScope *local_40;
  Literals *local_38;
  
  (this->locals).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->locals).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->locals).super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->function = function;
  this->parent = parent;
  (this->currDelegateTarget).super_IString.str._M_len = 0;
  (this->currDelegateTarget).super_IString.str._M_str = (char *)0x0;
  this->oldScope = (parent->super_ModuleRunnerBase<wasm::ModuleRunner>).scope;
  (parent->super_ModuleRunnerBase<wasm::ModuleRunner>).scope = this;
  psVar1 = &(parent->super_ModuleRunnerBase<wasm::ModuleRunner>).callDepth;
  *psVar1 = *psVar1 + 1;
  __position._M_current =
       (parent->super_ModuleRunnerBase<wasm::ModuleRunner>).functionStack.
       super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_40 = this;
  local_38 = arguments;
  if (__position._M_current ==
      (parent->super_ModuleRunnerBase<wasm::ModuleRunner>).functionStack.
      super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
              ((vector<wasm::Name,std::allocator<wasm::Name>> *)
               &(parent->super_ModuleRunnerBase<wasm::ModuleRunner>).functionStack,__position,
               (Name *)function);
  }
  else {
    pcVar8 = (function->super_Importable).super_Named.name.super_IString.str._M_str;
    ((__position._M_current)->super_IString).str._M_len =
         (function->super_Importable).super_Named.name.super_IString.str._M_len;
    ((__position._M_current)->super_IString).str._M_str = pcVar8;
    ppNVar2 = &(parent->super_ModuleRunnerBase<wasm::ModuleRunner>).functionStack.
               super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppNVar2 = *ppNVar2 + 1;
  }
  params.id = ::wasm::HeapType::getSignature();
  pcVar8 = (char *)Type::size(&params);
  pcVar13 = (char *)(((long)(local_38->super_SmallVector<wasm::Literal,_1UL>).flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_38->super_SmallVector<wasm::Literal,_1UL>).flexible.
                            super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
                    (local_38->super_SmallVector<wasm::Literal,_1UL>).usedFixed);
  if (pcVar8 != pcVar13) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Function `",10);
    name_00.super_IString.str._M_str = pcVar13;
    name_00.super_IString.str._M_len =
         (size_t)(function->super_Importable).super_Named.name.super_IString.str._M_str;
    poVar12 = wasm::operator<<((wasm *)&std::cerr,
                               (ostream *)
                               (function->super_Importable).super_Named.name.super_IString.str.
                               _M_len,name_00);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"` expects ",10);
    params.id = ::wasm::HeapType::getSignature();
    Type::size(&params);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," parameters, got ",0x11);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," arguments.",0xb);
    std::endl<char,std::char_traits<char>>(poVar12);
    ::wasm::handle_unreachable
              ("invalid param count",
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
               ,0xc8b);
  }
  __new_size = ::wasm::Function::getNumLocals();
  std::vector<wasm::Literals,_std::allocator<wasm::Literals>_>::resize(&local_40->locals,__new_size)
  ;
  local_b0 = ::wasm::HeapType::getSignature();
  local_70 = (local_38->super_SmallVector<wasm::Literal,_1UL>).fixed._M_elems;
  lVar14 = -0x18;
  lVar16 = 0x30;
  peVar15 = (element_type *)0x0;
  local_48 = function;
  do {
    peVar9 = (element_type *)::wasm::Function::getNumLocals();
    if (peVar9 <= peVar15) {
      return;
    }
    pLVar4 = (local_38->super_SmallVector<wasm::Literal,_1UL>).flexible.
             super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_start;
    peVar9 = (element_type *)
             (((long)(local_38->super_SmallVector<wasm::Literal,_1UL>).flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pLVar4 >> 3) * -0x5555555555555555 +
             (local_38->super_SmallVector<wasm::Literal,_1UL>).usedFixed);
    if (peVar15 < peVar9) {
      pLVar10 = (Literal *)((pLVar4->field_0).v128 + lVar14);
      if (peVar15 == (element_type *)0x0) {
        pLVar10 = local_70;
      }
      TVar5.id = (pLVar10->type).id;
      params.id = (uintptr_t)&local_b0;
      local_a0.exnData.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)peVar15;
      puVar11 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)&params);
      cVar7 = ::wasm::Type::isSubType(TVar5,(Type)*puVar11);
      if (cVar7 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Function `",10);
        name.super_IString.str._M_str = (char *)peVar9;
        name.super_IString.str._M_len =
             (size_t)(local_48->super_Importable).super_Named.name.super_IString.str._M_str;
        poVar12 = wasm::operator<<((wasm *)&std::cerr,
                                   (ostream *)
                                   (local_48->super_Importable).super_Named.name.super_IString.str.
                                   _M_len,name);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"` expects type ",0xf);
        params.id = (uintptr_t)&local_b0;
        local_a0.exnData.super___shared_ptr<wasm::ExnData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)peVar15;
        puVar11 = (uintptr_t *)::wasm::Type::Iterator::operator*((Iterator *)&params);
        poVar12 = (ostream *)::wasm::operator<<(poVar12,(Type)*puVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12," for parameter ",0xf);
        poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,", got ",6);
        pLVar10 = (Literal *)
                  ((((local_38->super_SmallVector<wasm::Literal,_1UL>).flexible.
                     super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                     super__Vector_impl_data._M_start)->field_0).v128 + lVar14);
        if (peVar15 == (element_type *)0x0) {
          pLVar10 = local_70;
        }
        poVar12 = (ostream *)::wasm::operator<<(poVar12,(Type)(pLVar10->type).id);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,".",1);
        std::endl<char,std::char_traits<char>>(poVar12);
        ::wasm::handle_unreachable
                  ("invalid param count",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                   ,0xc95);
      }
      pLVar10 = (Literal *)
                ((long)&((local_38->super_SmallVector<wasm::Literal,_1UL>).flexible.
                         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                         super__Vector_impl_data._M_start)->field_0 + lVar14);
      if (peVar15 == (element_type *)0x0) {
        pLVar10 = local_70;
      }
      ::wasm::Literal::Literal(&local_c8,pLVar10);
      init._M_len = 1;
      init._M_array = &local_c8;
      Literals::Literals((Literals *)&params,init);
      pLVar6 = (local_40->locals).
               super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(uintptr_t *)
       ((long)&(pLVar6->super_SmallVector<wasm::Literal,_1UL>).fixed + lVar16 + 0xffffffffffffffc8U)
           = params.id;
      ::wasm::Literal::operator=
                ((Literal *)
                 ((long)&(pLVar6->super_SmallVector<wasm::Literal,_1UL>).fixed +
                 lVar16 + 0xffffffffffffffd0U),(Literal *)&local_a0.func);
      puVar3 = (undefined8 *)
               ((long)&(pLVar6->super_SmallVector<wasm::Literal,_1UL>).fixed +
               lVar16 + 0xffffffffffffffe8U);
      local_68.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*puVar3;
      local_68.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)puVar3[1];
      local_68.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           *(pointer *)
            ((long)&(pLVar6->super_SmallVector<wasm::Literal,_1UL>).fixed +
            lVar16 + 0xfffffffffffffff8U);
      puVar3 = (undefined8 *)
               ((long)&(pLVar6->super_SmallVector<wasm::Literal,_1UL>).fixed +
               lVar16 + 0xffffffffffffffe8U);
      *puVar3 = local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar3[1] = local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                  .super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(pLVar6->super_SmallVector<wasm::Literal,_1UL>).fixed + lVar16 + 0xfffffffffffffff8U)
           = local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_68);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_88);
      ::wasm::Literal::~Literal((Literal *)&local_a0.func);
      ::wasm::Literal::~Literal(&local_c8);
    }
    else {
      cVar7 = ::wasm::Function::isVar((uint)local_48);
      if (cVar7 == '\0') {
        __assert_fail("function->isVar(i)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                      ,0xc99,
                      "wasm::ModuleRunnerBase<wasm::ModuleRunner>::FunctionScope::FunctionScope(Function *, const Literals &, SubType &) [SubType = wasm::ModuleRunner]"
                     );
      }
      ::wasm::Function::getLocalType((uint)local_48);
      ::wasm::Literal::makeZeros((Type)&params);
      pLVar6 = (local_40->locals).
               super__Vector_base<wasm::Literals,_std::allocator<wasm::Literals>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(uintptr_t *)
       ((long)&(pLVar6->super_SmallVector<wasm::Literal,_1UL>).fixed + lVar16 + 0xffffffffffffffc8U)
           = params.id;
      ::wasm::Literal::operator=
                ((Literal *)
                 ((long)&(pLVar6->super_SmallVector<wasm::Literal,_1UL>).fixed +
                 lVar16 + 0xffffffffffffffd0U),(Literal *)&local_a0.func);
      puVar3 = (undefined8 *)
               ((long)&(pLVar6->super_SmallVector<wasm::Literal,_1UL>).fixed +
               lVar16 + 0xffffffffffffffe8U);
      local_68.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)*puVar3;
      local_68.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)puVar3[1];
      local_68.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           *(pointer *)
            ((long)&(pLVar6->super_SmallVector<wasm::Literal,_1UL>).fixed +
            lVar16 + 0xfffffffffffffff8U);
      puVar3 = (undefined8 *)
               ((long)&(pLVar6->super_SmallVector<wasm::Literal,_1UL>).fixed +
               lVar16 + 0xffffffffffffffe8U);
      *puVar3 = local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                super__Vector_impl_data._M_start;
      puVar3[1] = local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl
                  .super__Vector_impl_data._M_finish;
      *(pointer *)
       ((long)&(pLVar6->super_SmallVector<wasm::Literal,_1UL>).fixed + lVar16 + 0xfffffffffffffff8U)
           = local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
      local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_88.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_68);
      std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_88);
      ::wasm::Literal::~Literal((Literal *)&local_a0.func);
    }
    peVar15 = (element_type *)((long)&(peVar15->type).id + 1);
    lVar14 = lVar14 + 0x18;
    lVar16 = lVar16 + 0x38;
  } while( true );
}

Assistant:

FunctionScope(Function* function,
                  const Literals& arguments,
                  SubType& parent)
      : function(function), parent(parent) {
      oldScope = parent.scope;
      parent.scope = this;
      parent.callDepth++;
      parent.functionStack.push_back(function->name);

      if (function->getParams().size() != arguments.size()) {
        std::cerr << "Function `" << function->name << "` expects "
                  << function->getParams().size() << " parameters, got "
                  << arguments.size() << " arguments." << std::endl;
        WASM_UNREACHABLE("invalid param count");
      }
      locals.resize(function->getNumLocals());
      Type params = function->getParams();
      for (size_t i = 0; i < function->getNumLocals(); i++) {
        if (i < arguments.size()) {
          if (!Type::isSubType(arguments[i].type, params[i])) {
            std::cerr << "Function `" << function->name << "` expects type "
                      << params[i] << " for parameter " << i << ", got "
                      << arguments[i].type << "." << std::endl;
            WASM_UNREACHABLE("invalid param count");
          }
          locals[i] = {arguments[i]};
        } else {
          assert(function->isVar(i));
          locals[i] = Literal::makeZeros(function->getLocalType(i));
        }
      }
    }